

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_GMAA_MAAstar.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  size_t h;
  size_t h_00;
  ProblemDecTiger pdt;
  
  ProblemDecTiger::ProblemDecTiger(&pdt);
  for (h_00 = 1; h_00 != 4; h_00 = h_00 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"------gmaa MAA* QBG  -horizon=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"-------");
    std::endl<char,std::char_traits<char>>(poVar1);
    TestGMAA_MAAstar(h_00,&pdt.super_DecPOMDPDiscrete,eQBG);
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"------gmaa MAA* QPOMDP  -horizon=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"----");
    std::endl<char,std::char_traits<char>>(poVar1);
    TestGMAA_MAAstar(h_00,&pdt.super_DecPOMDPDiscrete,eQPOMDP);
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"------gmaa MAA* QMDP  -horizon=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"------");
    std::endl<char,std::char_traits<char>>(poVar1);
    TestGMAA_MAAstar(h_00,&pdt.super_DecPOMDPDiscrete,eQMDP);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"\n\nTotal ticks ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," clock ticks = ");
  poVar1 = std::ostream::_M_insert<double>(0.0);
  poVar1 = std::operator<<(poVar1,"s");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Total utime = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," clock ticks = ");
  poVar1 = std::ostream::_M_insert<double>(0.0);
  poVar1 = std::operator<<(poVar1,"s");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProblemDecTiger::~ProblemDecTiger(&pdt);
  return 0;
}

Assistant:

int main()
{    
    ProblemDecTiger pdt;

    for(size_t h = 1; h < 4; h++)
    {

        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QBG  -horizon="<<h<<"-------"<<endl;
        TestGMAA_MAAstar(h, pdt, eQBG);        
        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QPOMDP  -horizon="<<h<<"----"<<endl;
        TestGMAA_MAAstar(h, pdt, eQPOMDP);
        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QMDP  -horizon="<<h<<"------"<<endl;
        TestGMAA_MAAstar(h, pdt, eQMDP);
    }
    
    cout << "\n\nTotal ticks "<< tot_ticks << " clock ticks = " << 
        (double)(tot_ticks) / cps <<"s" << endl <<
        "Total utime = "<< tot_utime << " clock ticks = "<< 
        (double (tot_utime))/ cps << "s" << endl;
}